

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_cwksp.h
# Opt level: O0

void duckdb_zstd::ZSTD_cwksp_clean_tables(ZSTD_cwksp *ws)

{
  long in_RDI;
  
  if (*(ulong *)(in_RDI + 0x20) < *(ulong *)(in_RDI + 0x18)) {
    memset(*(void **)(in_RDI + 0x20),0,*(long *)(in_RDI + 0x18) - *(long *)(in_RDI + 0x20));
  }
  ZSTD_cwksp_mark_tables_clean((ZSTD_cwksp *)0x8a66d4);
  return;
}

Assistant:

MEM_STATIC void ZSTD_cwksp_clean_tables(ZSTD_cwksp* ws) {
    DEBUGLOG(4, "cwksp: ZSTD_cwksp_clean_tables");
    assert(ws->tableValidEnd >= ws->objectEnd);
    assert(ws->tableValidEnd <= ws->allocStart);
    if (ws->tableValidEnd < ws->tableEnd) {
        ZSTD_memset(ws->tableValidEnd, 0, (size_t)((BYTE*)ws->tableEnd - (BYTE*)ws->tableValidEnd));
    }
    ZSTD_cwksp_mark_tables_clean(ws);
}